

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveSkip::CDirectiveSkip(CDirectiveSkip *this,Expression *expression)

{
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveSkip_001b9128;
  Expression::Expression(&this->expression,expression);
  return;
}

Assistant:

CDirectiveSkip::CDirectiveSkip(Expression& expression)
	: expression(expression) {}